

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSize(CodeGeneratorRequest *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  int iVar3;
  Type *value;
  Type *value_00;
  int i;
  int iVar4;
  int i_1;
  
  iVar4 = 0;
  iVar2 = 0;
  if ((this->_has_bits_[0] & 2) != 0) {
    iVar2 = internal::WireFormatLite::StringSize(this->parameter_);
    iVar2 = iVar2 + 1;
  }
  iVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = iVar2 + iVar3;
  for (; iVar4 < iVar3; iVar4 = iVar4 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(this->file_to_generate_).super_RepeatedPtrFieldBase,iVar4);
    iVar3 = internal::WireFormatLite::StringSize(value);
    iVar2 = iVar2 + iVar3;
    iVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar4 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = iVar2 + iVar4;
  for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                         (&(this->proto_file_).super_RepeatedPtrFieldBase,iVar3);
    iVar4 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FileDescriptorProto>
                      (value_00);
    iVar2 = iVar2 + iVar4;
    iVar4 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar4 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar2 = iVar2 + iVar4;
  }
  this->_cached_size_ = iVar2;
  return iVar2;
}

Assistant:

int CodeGeneratorRequest::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    // optional string parameter = 2;
    if (has_parameter()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->parameter());
    }

  }
  // repeated string file_to_generate = 1;
  total_size += 1 * this->file_to_generate_size();
  for (int i = 0; i < this->file_to_generate_size(); i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->file_to_generate(i));
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  total_size += 1 * this->proto_file_size();
  for (int i = 0; i < this->proto_file_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->proto_file(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}